

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall
tetgenmesh::flipcertify
          (tetgenmesh *this,triface *chkface,badface **pqueue,point plane_pa,point plane_pb,
          point plane_pc)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  tetrahedron *pppdVar4;
  tetrahedron pb;
  tetrahedron pa;
  tetrahedron pc;
  tetrahedron pd;
  tetrahedron pe;
  badface *pbVar5;
  badface *pbVar6;
  int iVar7;
  badface *pbVar8;
  int iVar9;
  badface **ppbVar10;
  tetgenmesh *this_00;
  long lVar11;
  double dVar12;
  double w [5];
  point p [5];
  double local_a8 [6];
  tetrahedron local_78 [6];
  double local_48;
  
  pppdVar4 = chkface->tet;
  uVar1 = chkface->ver;
  pb = pppdVar4[orgpivot[(int)uVar1]];
  local_78[0] = pb;
  pa = pppdVar4[destpivot[(int)uVar1]];
  local_78[1] = pa;
  pc = pppdVar4[apexpivot[(int)uVar1]];
  local_78[2] = pc;
  pd = pppdVar4[oppopivot[(int)uVar1]];
  local_78[3] = pd;
  pe = *(tetrahedron *)
        (((ulong)pppdVar4[uVar1 & 3] & 0xfffffffffffffff0) +
        (long)oppopivot[fsymtbl[(int)uVar1][(uint)pppdVar4[uVar1 & 3] & 0xf]] * 8);
  local_78[4] = pe;
  lVar11 = 0;
  iVar7 = 0;
  iVar9 = 0;
  do {
    uVar2 = *(uint *)((long)local_78[lVar11] + (long)this->pointmarkindex * 4 + 4);
    iVar9 = iVar9 + (uint)((uVar2 >> 2 & 1) != 0);
    iVar7 = iVar7 + (uint)((uVar2 >> 3 & 1) != 0);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  this_00 = (tetgenmesh *)CONCAT71((int7)(int3)((uint)this->pointmarkindex >> 8),iVar9 == 0);
  iVar3 = this->pointmarkindex;
  if (iVar7 == 0 || iVar9 == 0) {
    lVar11 = 0;
    do {
      uVar2 = *(uint *)((long)local_78[lVar11 + 3] + (long)iVar3 * 4 + 4);
      iVar9 = iVar9 + (uint)((uVar2 >> 2 & 1) != 0);
      iVar7 = iVar7 + (uint)((uVar2 >> 3 & 1) != 0);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 2);
    if ((iVar9 != 0) && (iVar7 != 0)) {
      return;
    }
    if (pd == (tetrahedron)this->dummypoint) {
      return;
    }
    if (pe == (tetrahedron)this->dummypoint) {
      return;
    }
    if ((pppdVar4[9] != (tetrahedron)0x0) && ((double *)0x7 < pppdVar4[9][uVar1 & 3])) {
      return;
    }
    dVar12 = insphere_s(this,(double *)pa,(double *)pb,(double *)pc,(double *)pd,(double *)pe);
    if (dVar12 <= 0.0) {
      return;
    }
    if (2 < this->b->verbose) {
      lVar11 = (long)this->pointmarkindex;
      printf("      A locally non-Delanay face (%d, %d, %d)-%d,%d\n",
             (ulong)*(uint *)((long)pb + lVar11 * 4),(ulong)*(uint *)((long)pa + lVar11 * 4),
             (ulong)*(uint *)((long)pc + lVar11 * 4),(ulong)*(uint *)((long)pd + lVar11 * 4),
             (ulong)*(uint *)((long)pe + lVar11 * 4));
    }
    pbVar5 = (badface *)memorypool::alloc(this->flippool);
    pbVar5->key = 0.0;
    (pbVar5->tt).tet = chkface->tet;
    (pbVar5->tt).ver = chkface->ver;
    pbVar5->forg = (point)pb;
    pbVar5->fdest = (point)pa;
    pbVar5->fapex = (point)pc;
    pbVar5->foppo = (point)pd;
    pbVar5->noppo = (point)pe;
    if (*pqueue != (badface *)0x0) {
      pbVar5->nextitem = *pqueue;
      *pqueue = pbVar5;
      return;
    }
    *pqueue = pbVar5;
  }
  else {
    lVar11 = 0;
    do {
      if ((*(byte *)((long)local_78[lVar11] + (long)iVar3 * 4 + 4) & 4) == 0) {
        local_a8[lVar11] = 0.0;
      }
      else {
        dVar12 = orient3dfast(this_00,plane_pa,plane_pb,plane_pc,(double *)local_78[lVar11]);
        local_a8[lVar11] = dVar12;
        if (dVar12 < 0.0) {
          local_a8[lVar11] = -dVar12;
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 5);
    local_48 = insphere((double *)pa,(double *)pb,(double *)pc,(double *)pd,(double *)pe);
    dVar12 = orient4d((double *)pa,(double *)pb,(double *)pc,(double *)pd,(double *)pe,local_a8[1],
                      local_a8[0],local_a8[2],local_a8[3],local_a8[4]);
    if (dVar12 <= 0.0) {
      return;
    }
    if (2 < this->b->verbose) {
      lVar11 = (long)this->pointmarkindex;
      printf("      Insert face (%d, %d, %d) - %d, %d\n",(ulong)*(uint *)((long)pb + lVar11 * 4),
             (ulong)*(uint *)((long)pa + lVar11 * 4),(ulong)*(uint *)((long)pc + lVar11 * 4),
             (ulong)*(uint *)((long)pd + lVar11 * 4),(ulong)*(uint *)((long)pe + lVar11 * 4));
    }
    pbVar5 = (badface *)memorypool::alloc(this->flippool);
    dVar12 = -local_48 / dVar12;
    pbVar5->key = dVar12;
    (pbVar5->tt).tet = chkface->tet;
    (pbVar5->tt).ver = chkface->ver;
    pbVar5->forg = (point)pb;
    pbVar5->fdest = (point)pa;
    pbVar5->fapex = (point)pc;
    pbVar5->foppo = (point)pd;
    pbVar5->noppo = (point)pe;
    pbVar6 = *pqueue;
    if (pbVar6 != (badface *)0x0) {
      if (dVar12 < pbVar6->key || dVar12 == pbVar6->key) {
        pbVar8 = (badface *)0x0;
      }
      else {
        do {
          pbVar8 = pbVar6;
          pbVar6 = pbVar8->nextitem;
          if (pbVar6 == (badface *)0x0) break;
        } while (pbVar6->key <= dVar12 && dVar12 != pbVar6->key);
      }
      ppbVar10 = &pbVar8->nextitem;
      if (pbVar8 == (badface *)0x0) {
        ppbVar10 = pqueue;
      }
      *ppbVar10 = pbVar5;
      pbVar5->nextitem = pbVar6;
      return;
    }
    *pqueue = pbVar5;
  }
  pbVar5->nextitem = (badface *)0x0;
  return;
}

Assistant:

void tetgenmesh::flipcertify(triface *chkface,badface **pqueue,point plane_pa,
                             point plane_pb, point plane_pc)
{
  badface *parybf, *prevbf, *nextbf;
  triface neightet;
  face checksh;
  point p[5];
  REAL w[5];
  REAL insph, ori4;
  int topi, boti;
  int i;

  // Compute the flip time \tau.
  fsym(*chkface, neightet);

  p[0] = org(*chkface);
  p[1] = dest(*chkface);
  p[2] = apex(*chkface);
  p[3] = oppo(*chkface);
  p[4] = oppo(neightet);

  // Check if the face is a crossing face.
  topi = boti = 0;
  for (i = 0; i < 3; i++) {
    if (pmarktest2ed(p[i])) topi++;
    if (pmarktest3ed(p[i])) boti++;
  }
  if ((topi == 0) || (boti == 0)) {
    // It is not a crossing face.
    // return;
    for (i = 3; i < 5; i++) {
      if (pmarktest2ed(p[i])) topi++;
      if (pmarktest3ed(p[i])) boti++;
    }
    if ((topi == 0) || (boti == 0)) {
      // The two tets sharing at this face are on one side of the facet.
      // Check if this face is locally Delaunay (due to rounding error).
      if ((p[3] != dummypoint) && (p[4] != dummypoint)) {
        // Do not check it if it is a subface.
        tspivot(*chkface, checksh);
        if (checksh.sh == NULL) {
          insph = insphere_s(p[1], p[0], p[2], p[3], p[4]);
          if (insph > 0) {
            // Add the face into queue.
            if (b->verbose > 2) {
              printf("      A locally non-Delanay face (%d, %d, %d)-%d,%d\n", 
                     pointmark(p[0]), pointmark(p[1]), pointmark(p[2]), 
                     pointmark(p[3]), pointmark(p[4]));
            }
            parybf = (badface *) flippool->alloc();
            parybf->key = 0.;  // tau = 0, do immediately.
            parybf->tt = *chkface;
            parybf->forg = p[0];
            parybf->fdest = p[1];
            parybf->fapex = p[2];
            parybf->foppo = p[3];
            parybf->noppo = p[4];
            // Add it at the top of the priority queue.
            if (*pqueue == NULL) {
              *pqueue = parybf;
              parybf->nextitem = NULL;
            } else {
              parybf->nextitem = *pqueue;
              *pqueue = parybf;
            }
          } // if (insph > 0)
        } // if (checksh.sh == NULL)
      }
    }
    return; // Test: omit this face.
  }

  // Decide the "height" for each point.
  for (i = 0; i < 5; i++) {
    if (pmarktest2ed(p[i])) {
      // A top point has a positive weight.
      w[i] = orient3dfast(plane_pa, plane_pb, plane_pc, p[i]);      
      if (w[i] < 0) w[i] = -w[i];
    } else {
      w[i] = 0;
    }
  }

  insph = insphere(p[1], p[0], p[2], p[3], p[4]);
  ori4 = orient4d(p[1], p[0], p[2], p[3], p[4], w[1], w[0], w[2], w[3], w[4]);
  if (ori4 > 0) {
    // Add the face into queue.
    if (b->verbose > 2) {
      printf("      Insert face (%d, %d, %d) - %d, %d\n", pointmark(p[0]),
        pointmark(p[1]), pointmark(p[2]), pointmark(p[3]), pointmark(p[4]));
    }
    
    parybf = (badface *) flippool->alloc();

    parybf->key = -insph / ori4;
    parybf->tt = *chkface;
    parybf->forg = p[0];
    parybf->fdest = p[1];
    parybf->fapex = p[2];
    parybf->foppo = p[3];
    parybf->noppo = p[4];

    // Push the face into priority queue.
    //pq.push(bface);
    if (*pqueue == NULL) {
      *pqueue = parybf;
      parybf->nextitem = NULL;
    } else {
      // Search an item whose key is larger or equal to current key.
      prevbf = NULL;
      nextbf = *pqueue;
      //if (!b->flipinsert_random) { // Default use a priority queue.
        // Insert the item into priority queue.
        while (nextbf != NULL) {
          if (nextbf->key < parybf->key) {
            prevbf = nextbf;
            nextbf = nextbf->nextitem;
          } else {
            break;
          }
        }
      //} // if (!b->flipinsert_random)
      // Insert the new item between prev and next items.
      if (prevbf == NULL) {
        *pqueue = parybf;
      } else {
        prevbf->nextitem = parybf;
      }
      parybf->nextitem = nextbf;
    }
  } else if (ori4 == 0) {
    
  }
}